

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O3

void __thiscall
db_unpacker::extract_2215(db_unpacker *this,string *prefix,string *mask,xr_reader *s,uint8_t *data)

{
  uint32_t size_real;
  uint32_t size_compressed;
  uint *puVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  uint8_t *puVar5;
  ulong uVar6;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68;
  string local_60;
  uint8_t *local_40;
  string *local_38;
  
  local_68 = prefix;
  local_40 = data;
  local_38 = mask;
  if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar2 != 0)) {
    xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
    __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                 &xray_re::xr_file_system::instance::instance0,&__dso_handle);
    __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  puVar3 = (s->field_2).m_p;
  puVar5 = s->m_end;
  if (puVar3 <= puVar5) {
    do {
      if (puVar3 == puVar5) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      xray_re::xr_reader::r_sz(s,&local_60);
      puVar1 = (s->field_2).m_p_u32;
      (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar6 = (ulong)*puVar1;
      (s->field_2).m_p = (uint8_t *)(puVar1 + 2);
      size_real = puVar1[1];
      (s->field_2).m_p = (uint8_t *)(puVar1 + 3);
      size_compressed = puVar1[2];
      if (local_38->_M_string_length == 0 || uVar6 == 0) {
        if (uVar6 != 0) goto LAB_0012048e;
        std::operator+(&local_88,local_68,&local_60);
        xray_re::xr_file_system::create_folder
                  (&xray_re::xr_file_system::instance::instance0,local_88._M_dataplus._M_p);
LAB_001204e4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        lVar4 = std::__cxx11::string::find((char *)&local_60,(ulong)(local_38->_M_dataplus)._M_p,0);
        if (lVar4 != -1) {
LAB_0012048e:
          std::operator+(&local_88,local_68,&local_60);
          write_file(&xray_re::xr_file_system::instance::instance0,&local_88,local_40 + uVar6,
                     size_real,size_compressed);
          goto LAB_001204e4;
        }
      }
      puVar3 = (s->field_2).m_p;
      puVar5 = s->m_end;
    } while (puVar3 <= puVar5);
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_reader.h"
                ,0x7e,"bool xray_re::xr_reader::eof() const");
}

Assistant:

void db_unpacker::extract_2215(const std::string& prefix, const std::string& mask, xr_reader* s, const uint8_t* data) const
{
	xr_file_system& fs = xr_file_system::instance();
	for (std::string path; !s->eof(); ) {
		s->r_sz(path);
		unsigned offset = s->r_u32();
		unsigned size_real = s->r_u32();
		unsigned size_compressed = s->r_u32();

		if (mask.length() && (offset != 0))
		//if (path.compare(path.size()-mask.size(),mask.size(),mask) != 0)
		if (path.find(mask) == -1)
		continue;

		if (DB_DEBUG && fs.read_only()) {
			msg("%s", path.c_str());
			msg("  offset: %u", offset);
			msg("  size (real): %u", size_real);
			msg("  size (compressed): %u", size_compressed);
		} else if (offset == 0) {
			fs.create_folder(prefix + path);
		} else {
			write_file(fs, prefix + path, data + offset, size_real, size_compressed);
		}
	}
}